

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Cube::forward_impl
          (Cube *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  float *pfVar1;
  float fVar2;
  Tensor *pTVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  uint uVar10;
  Index size;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar11;
  
  pTVar3 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar11 = (ulong)(pTVar3->d).nd;
  iVar9 = 1;
  iVar12 = 1;
  if (uVar11 != 0) {
    uVar14 = 0;
    do {
      iVar12 = iVar12 * (pTVar3->d).d[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar11 != uVar14);
  }
  uVar11 = (ulong)(fx->d).nd;
  if (uVar11 != 0) {
    iVar9 = 1;
    uVar14 = 0;
    do {
      iVar9 = iVar9 * (fx->d).d[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar11 != uVar14);
  }
  uVar10 = iVar9 * (fx->d).bd;
  uVar11 = (ulong)uVar10;
  if (uVar10 == iVar12 * (pTVar3->d).bd) {
    pfVar4 = fx->v;
    uVar14 = uVar11;
    if ((((ulong)pfVar4 & 3) == 0) &&
       (uVar14 = (ulong)(-((uint)((ulong)pfVar4 >> 2) & 0x3fffffff) & 3), uVar11 <= uVar14)) {
      uVar14 = uVar11;
    }
    pfVar5 = pTVar3->v;
    uVar15 = uVar11 - uVar14;
    uVar13 = uVar15 + 3;
    if (-1 < (long)uVar15) {
      uVar13 = uVar15;
    }
    if (uVar14 != 0) {
      uVar16 = 0;
      do {
        fVar2 = pfVar5[uVar16];
        pfVar4[uVar16] = fVar2 * fVar2 * fVar2;
        uVar16 = uVar16 + 1;
      } while (uVar14 != uVar16);
    }
    uVar13 = (uVar13 & 0xfffffffffffffffc) + uVar14;
    if (3 < (long)uVar15) {
      do {
        pfVar1 = pfVar5 + uVar14;
        fVar2 = *pfVar1;
        fVar6 = pfVar1[1];
        fVar7 = pfVar1[2];
        fVar8 = pfVar1[3];
        pfVar1 = pfVar4 + uVar14;
        *pfVar1 = fVar2 * fVar2 * fVar2;
        pfVar1[1] = fVar6 * fVar6 * fVar6;
        pfVar1[2] = fVar7 * fVar7 * fVar7;
        pfVar1[3] = fVar8 * fVar8 * fVar8;
        uVar14 = uVar14 + 4;
      } while ((long)uVar14 < (long)uVar13);
    }
    if ((long)uVar13 < (long)uVar11) {
      do {
        fVar2 = pfVar5[uVar13];
        pfVar4[uVar13] = fVar2 * fVar2 * fVar2;
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
    return;
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
               );
}

Assistant:

void Cube::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Square not yet implemented for CUDA");
#else
  fx.vec().array() = xs[0]->vec().array().cube();
#endif
}